

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ScalarReplacementPass::CheckUsesRelaxed
          (ScalarReplacementPass *this,Instruction *inst)

{
  Instruction *def;
  DefUseManager *this_00;
  anon_class_16_2_e8808157 local_50;
  function<void_(spvtools::opt::Instruction_*,_unsigned_int)> local_40;
  bool local_19;
  Instruction *pIStack_18;
  bool ok;
  Instruction *inst_local;
  ScalarReplacementPass *this_local;
  
  local_19 = true;
  pIStack_18 = inst;
  inst_local = (Instruction *)this;
  this_00 = Pass::get_def_use_mgr((Pass *)this);
  def = pIStack_18;
  local_50.ok = &local_19;
  local_50.this = this;
  std::function<void(spvtools::opt::Instruction*,unsigned_int)>::
  function<spvtools::opt::ScalarReplacementPass::CheckUsesRelaxed(spvtools::opt::Instruction_const*)const::__0,void>
            ((function<void(spvtools::opt::Instruction*,unsigned_int)> *)&local_40,&local_50);
  analysis::DefUseManager::ForEachUse(this_00,def,&local_40);
  std::function<void_(spvtools::opt::Instruction_*,_unsigned_int)>::~function(&local_40);
  return (bool)(local_19 & 1);
}

Assistant:

bool ScalarReplacementPass::CheckUsesRelaxed(const Instruction* inst) const {
  bool ok = true;
  get_def_use_mgr()->ForEachUse(
      inst, [this, &ok](const Instruction* user, uint32_t index) {
        switch (user->opcode()) {
          case spv::Op::OpAccessChain:
          case spv::Op::OpInBoundsAccessChain:
            if (index != 2u) {
              ok = false;
            } else {
              if (!CheckUsesRelaxed(user)) ok = false;
            }
            break;
          case spv::Op::OpLoad:
            if (!CheckLoad(user, index)) ok = false;
            break;
          case spv::Op::OpStore:
            if (!CheckStore(user, index)) ok = false;
            break;
          case spv::Op::OpImageTexelPointer:
            if (!CheckImageTexelPointer(index)) ok = false;
            break;
          case spv::Op::OpExtInst:
            if (user->GetCommonDebugOpcode() != CommonDebugInfoDebugDeclare ||
                !CheckDebugDeclare(index))
              ok = false;
            break;
          default:
            ok = false;
            break;
        }
      });

  return ok;
}